

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSolve.c
# Opt level: O1

void Cec_CnfNodeAddToSolver(Cec_ManSat_t *p,Gia_Obj_t *pObj)

{
  uint uVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  void **ppvVar8;
  Vec_Ptr_t *pVVar9;
  ulong uVar10;
  Vec_Ptr_t *pVVar11;
  long lVar12;
  long lVar13;
  
  pGVar3 = p->pAig->pObjs;
  if ((pObj < pGVar3) || (pGVar3 + p->pAig->nObjs <= pObj)) goto LAB_0065017b;
  if (p->pSatVars[(int)((ulong)((long)pObj - (long)pGVar3) >> 2) * -0x55555555] != 0) {
    return;
  }
  uVar6 = (uint)*(undefined8 *)pObj;
  if ((~uVar6 & 0x9fffffff) != 0) {
    if (((int)uVar6 < 0) || ((uVar6 & 0x1fffffff) == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSolve.c"
                    ,0x141,"void Cec_CnfNodeAddToSolver(Cec_ManSat_t *, Gia_Obj_t *)");
    }
    pVVar9 = (Vec_Ptr_t *)malloc(0x10);
    pVVar9->nCap = 100;
    pVVar9->nSize = 0;
    ppvVar8 = (void **)malloc(800);
    pVVar9->pArray = ppvVar8;
    Cec_ObjAddToFrontier(p,pObj,pVVar9);
    if (0 < pVVar9->nSize) {
      lVar13 = 0;
      do {
        pGVar3 = (Gia_Obj_t *)pVVar9->pArray[lVar13];
        pGVar4 = p->pAig->pObjs;
        if ((pGVar3 < pGVar4) || (pGVar4 + p->pAig->nObjs <= pGVar3)) goto LAB_0065017b;
        if (p->pSatVars[(int)((ulong)((long)pGVar3 - (long)pGVar4) >> 2) * -0x55555555] == 0) {
          __assert_fail("Cec_ObjSatNum(p,pNode)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSolve.c"
                        ,0x149,"void Cec_CnfNodeAddToSolver(Cec_ManSat_t *, Gia_Obj_t *)");
        }
        iVar7 = Gia_ObjIsMuxType(pGVar3);
        if (iVar7 == 0) {
          Cec_CollectSuper(pGVar3,1,p->vFanins);
          pVVar11 = p->vFanins;
          if (0 < pVVar11->nSize) {
            lVar12 = 0;
            do {
              Cec_ObjAddToFrontier
                        (p,(Gia_Obj_t *)((ulong)pVVar11->pArray[lVar12] & 0xfffffffffffffffe),pVVar9
                        );
              lVar12 = lVar12 + 1;
              pVVar11 = p->vFanins;
            } while (lVar12 < pVVar11->nSize);
          }
          Cec_AddClausesSuper(p,pGVar3,pVVar11);
        }
        else {
          pVVar11 = p->vFanins;
          pVVar11->nSize = 0;
          uVar10 = *(ulong *)pGVar3;
          uVar5 = *(ulong *)(pGVar3 + -(uVar10 & 0x1fffffff));
          if (pVVar11->nCap == 0) {
            if (pVVar11->pArray == (void **)0x0) {
              ppvVar8 = (void **)malloc(0x80);
            }
            else {
              ppvVar8 = (void **)realloc(pVVar11->pArray,0x80);
            }
            pVVar11->pArray = ppvVar8;
            pVVar11->nCap = 0x10;
          }
          iVar7 = pVVar11->nSize;
          pVVar11->nSize = iVar7 + 1;
          pVVar11->pArray[iVar7] = pGVar3 + (-(uVar10 & 0x1fffffff) - (uVar5 & 0x1fffffff));
          pVVar11 = p->vFanins;
          pGVar4 = pGVar3 + -((ulong)*(uint *)&pGVar3->field_0x4 & 0x1fffffff);
          uVar10 = *(ulong *)pGVar4;
          uVar6 = pVVar11->nSize;
          if (0 < (long)(int)uVar6) {
            lVar12 = 0;
            do {
              if ((Gia_Obj_t *)pVVar11->pArray[lVar12] == pGVar4 + -(uVar10 & 0x1fffffff))
              goto LAB_0064feab;
              lVar12 = lVar12 + 1;
            } while ((int)uVar6 != lVar12);
          }
          uVar1 = pVVar11->nCap;
          if (uVar6 == uVar1) {
            if ((int)uVar1 < 0x10) {
              if (pVVar11->pArray == (void **)0x0) {
                ppvVar8 = (void **)malloc(0x80);
              }
              else {
                ppvVar8 = (void **)realloc(pVVar11->pArray,0x80);
              }
              pVVar11->pArray = ppvVar8;
              iVar7 = 0x10;
            }
            else {
              iVar7 = uVar1 * 2;
              if (iVar7 <= (int)uVar1) goto LAB_0064fe99;
              if (pVVar11->pArray == (void **)0x0) {
                ppvVar8 = (void **)malloc((ulong)uVar1 << 4);
              }
              else {
                ppvVar8 = (void **)realloc(pVVar11->pArray,(ulong)uVar1 << 4);
              }
              pVVar11->pArray = ppvVar8;
            }
            pVVar11->nCap = iVar7;
          }
LAB_0064fe99:
          iVar7 = pVVar11->nSize;
          pVVar11->nSize = iVar7 + 1;
          pVVar11->pArray[iVar7] = pGVar4 + -(uVar10 & 0x1fffffff);
LAB_0064feab:
          pVVar11 = p->vFanins;
          uVar10 = *(ulong *)pGVar3;
          uVar6 = *(uint *)&pGVar3[-(uVar10 & 0x1fffffff)].field_0x4;
          uVar1 = pVVar11->nSize;
          if (0 < (long)(int)uVar1) {
            lVar12 = 0;
            do {
              if ((Gia_Obj_t *)pVVar11->pArray[lVar12] ==
                  pGVar3 + (-(uVar10 & 0x1fffffff) - ((ulong)uVar6 & 0x1fffffff)))
              goto LAB_0064ff75;
              lVar12 = lVar12 + 1;
            } while ((int)uVar1 != lVar12);
          }
          uVar2 = pVVar11->nCap;
          if (uVar1 == uVar2) {
            if ((int)uVar2 < 0x10) {
              if (pVVar11->pArray == (void **)0x0) {
                ppvVar8 = (void **)malloc(0x80);
              }
              else {
                ppvVar8 = (void **)realloc(pVVar11->pArray,0x80);
              }
              pVVar11->pArray = ppvVar8;
              iVar7 = 0x10;
            }
            else {
              iVar7 = uVar2 * 2;
              if (iVar7 <= (int)uVar2) goto LAB_0064ff63;
              if (pVVar11->pArray == (void **)0x0) {
                ppvVar8 = (void **)malloc((ulong)uVar2 << 4);
              }
              else {
                ppvVar8 = (void **)realloc(pVVar11->pArray,(ulong)uVar2 << 4);
              }
              pVVar11->pArray = ppvVar8;
            }
            pVVar11->nCap = iVar7;
          }
LAB_0064ff63:
          iVar7 = pVVar11->nSize;
          pVVar11->nSize = iVar7 + 1;
          pVVar11->pArray[iVar7] = pGVar3 + (-(uVar10 & 0x1fffffff) - ((ulong)uVar6 & 0x1fffffff));
LAB_0064ff75:
          pVVar11 = p->vFanins;
          uVar10 = (ulong)*(uint *)&pGVar3->field_0x4 & 0x1fffffff;
          uVar6 = *(uint *)&pGVar3[-uVar10].field_0x4;
          uVar1 = pVVar11->nSize;
          if (0 < (long)(int)uVar1) {
            lVar12 = 0;
            do {
              if ((Gia_Obj_t *)pVVar11->pArray[lVar12] ==
                  pGVar3 + (-uVar10 - ((ulong)uVar6 & 0x1fffffff))) goto LAB_0065003b;
              lVar12 = lVar12 + 1;
            } while ((int)uVar1 != lVar12);
          }
          uVar2 = pVVar11->nCap;
          if (uVar1 == uVar2) {
            if ((int)uVar2 < 0x10) {
              if (pVVar11->pArray == (void **)0x0) {
                ppvVar8 = (void **)malloc(0x80);
              }
              else {
                ppvVar8 = (void **)realloc(pVVar11->pArray,0x80);
              }
              pVVar11->pArray = ppvVar8;
              iVar7 = 0x10;
            }
            else {
              iVar7 = uVar2 * 2;
              if (iVar7 <= (int)uVar2) goto LAB_00650029;
              if (pVVar11->pArray == (void **)0x0) {
                ppvVar8 = (void **)malloc((ulong)uVar2 << 4);
              }
              else {
                ppvVar8 = (void **)realloc(pVVar11->pArray,(ulong)uVar2 << 4);
              }
              pVVar11->pArray = ppvVar8;
            }
            pVVar11->nCap = iVar7;
          }
LAB_00650029:
          iVar7 = pVVar11->nSize;
          pVVar11->nSize = iVar7 + 1;
          pVVar11->pArray[iVar7] = pGVar3 + (-uVar10 - ((ulong)uVar6 & 0x1fffffff));
LAB_0065003b:
          pVVar11 = p->vFanins;
          if (0 < pVVar11->nSize) {
            lVar12 = 0;
            do {
              Cec_ObjAddToFrontier
                        (p,(Gia_Obj_t *)((ulong)pVVar11->pArray[lVar12] & 0xfffffffffffffffe),pVVar9
                        );
              lVar12 = lVar12 + 1;
              pVVar11 = p->vFanins;
            } while (lVar12 < pVVar11->nSize);
          }
          Cec_AddClausesMux(p,pGVar3);
        }
        if (p->vFanins->nSize < 2) {
          __assert_fail("Vec_PtrSize(p->vFanins) > 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSolve.c"
                        ,0x15c,"void Cec_CnfNodeAddToSolver(Cec_ManSat_t *, Gia_Obj_t *)");
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 < pVVar9->nSize);
    }
    if (pVVar9->pArray != (void **)0x0) {
      free(pVVar9->pArray);
      pVVar9->pArray = (void **)0x0;
    }
    free(pVVar9);
    return;
  }
  pVVar9 = p->vUsedNodes;
  uVar6 = pVVar9->nCap;
  if (pVVar9->nSize == uVar6) {
    if ((int)uVar6 < 0x10) {
      if (pVVar9->pArray == (void **)0x0) {
        ppvVar8 = (void **)malloc(0x80);
      }
      else {
        ppvVar8 = (void **)realloc(pVVar9->pArray,0x80);
      }
      pVVar9->pArray = ppvVar8;
      iVar7 = 0x10;
    }
    else {
      iVar7 = uVar6 * 2;
      if (iVar7 <= (int)uVar6) goto LAB_0065010f;
      if (pVVar9->pArray == (void **)0x0) {
        ppvVar8 = (void **)malloc((ulong)uVar6 << 4);
      }
      else {
        ppvVar8 = (void **)realloc(pVVar9->pArray,(ulong)uVar6 << 4);
      }
      pVVar9->pArray = ppvVar8;
    }
    pVVar9->nCap = iVar7;
  }
LAB_0065010f:
  iVar7 = pVVar9->nSize;
  pVVar9->nSize = iVar7 + 1;
  pVVar9->pArray[iVar7] = pObj;
  iVar7 = p->nSatVars;
  p->nSatVars = iVar7 + 1;
  pGVar3 = p->pAig->pObjs;
  if ((pGVar3 <= pObj) && (pObj < pGVar3 + p->pAig->nObjs)) {
    p->pSatVars[(int)((ulong)((long)pObj - (long)pGVar3) >> 2) * -0x55555555] = iVar7;
    sat_solver_setnvars(p->pSat,p->nSatVars);
    return;
  }
LAB_0065017b:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Cec_CnfNodeAddToSolver( Cec_ManSat_t * p, Gia_Obj_t * pObj )
{ 
    Vec_Ptr_t * vFrontier;
    Gia_Obj_t * pNode, * pFanin;
    int i, k, fUseMuxes = 1;
    // quit if CNF is ready
    if ( Cec_ObjSatNum(p,pObj) )
        return;
    if ( Gia_ObjIsCi(pObj) )
    {
        Vec_PtrPush( p->vUsedNodes, pObj );
        Cec_ObjSetSatNum( p, pObj, p->nSatVars++ );
        sat_solver_setnvars( p->pSat, p->nSatVars );
        return;
    }
    assert( Gia_ObjIsAnd(pObj) );
    // start the frontier
    vFrontier = Vec_PtrAlloc( 100 );
    Cec_ObjAddToFrontier( p, pObj, vFrontier );
    // explore nodes in the frontier
    Vec_PtrForEachEntry( Gia_Obj_t *, vFrontier, pNode, i )
    {
        // create the supergate
        assert( Cec_ObjSatNum(p,pNode) );
        if ( fUseMuxes && Gia_ObjIsMuxType(pNode) )
        {
            Vec_PtrClear( p->vFanins );
            Vec_PtrPushUnique( p->vFanins, Gia_ObjFanin0( Gia_ObjFanin0(pNode) ) );
            Vec_PtrPushUnique( p->vFanins, Gia_ObjFanin0( Gia_ObjFanin1(pNode) ) );
            Vec_PtrPushUnique( p->vFanins, Gia_ObjFanin1( Gia_ObjFanin0(pNode) ) );
            Vec_PtrPushUnique( p->vFanins, Gia_ObjFanin1( Gia_ObjFanin1(pNode) ) );
            Vec_PtrForEachEntry( Gia_Obj_t *, p->vFanins, pFanin, k )
                Cec_ObjAddToFrontier( p, Gia_Regular(pFanin), vFrontier );
            Cec_AddClausesMux( p, pNode );
        }
        else
        {
            Cec_CollectSuper( pNode, fUseMuxes, p->vFanins );
            Vec_PtrForEachEntry( Gia_Obj_t *, p->vFanins, pFanin, k )
                Cec_ObjAddToFrontier( p, Gia_Regular(pFanin), vFrontier );
            Cec_AddClausesSuper( p, pNode, p->vFanins );
        }
        assert( Vec_PtrSize(p->vFanins) > 1 );
    }
    Vec_PtrFree( vFrontier );
}